

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O2

void Abc_NtkRedirectCiCo(Abc_Ntk_t *pNtk)

{
  Nm_Man_t *p;
  Abc_Obj_t *pNode;
  int iVar1;
  Abc_Obj_t *pObj;
  char *pcVar2;
  Abc_Obj_t *pObj_00;
  char *__s2;
  uint uVar3;
  int i;
  
  uVar3 = 0;
  i = 0;
  do {
    if (pNtk->vCos->nSize <= i) {
      if (uVar3 != 0) {
        printf("Redirected %d POs from buffers to PIs with the same name.\n",(ulong)uVar3);
        return;
      }
      return;
    }
    pObj = Abc_NtkCo(pNtk,i);
    p = pNtk->pManName;
    pcVar2 = Abc_ObjName(pObj);
    iVar1 = Nm_ManFindIdByNameTwoTypes(p,pcVar2,2,5);
    if (iVar1 != -1) {
      pObj_00 = Abc_NtkObj(pNtk,iVar1);
      pcVar2 = Abc_ObjName(pObj);
      __s2 = Abc_ObjName(pObj_00);
      iVar1 = strcmp(pcVar2,__s2);
      if (iVar1 != 0) {
        __assert_fail("!strcmp( Abc_ObjName(pObj), Abc_ObjName(pObjCi) )",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNames.c"
                      ,0x278,"void Abc_NtkRedirectCiCo(Abc_Ntk_t *)");
      }
      pNode = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
      if (pNode != pObj_00) {
        iVar1 = Abc_NodeIsBuf(pNode);
        if (iVar1 == 0) {
          __assert_fail("Abc_NodeIsBuf(pFanin)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNames.c"
                        ,0x27c,"void Abc_NtkRedirectCiCo(Abc_Ntk_t *)");
        }
        Abc_ObjPatchFanin(pObj,pNode,pObj_00);
        if ((pNode->vFanouts).nSize == 0) {
          Abc_NtkDeleteObj(pNode);
        }
        uVar3 = uVar3 + 1;
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Abc_NtkRedirectCiCo( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pObjCi, * pFanin; 
    int i, Count = 0;
    // if CO points to CI with the same name, remove buffer between them
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        int nCiId = Nm_ManFindIdByNameTwoTypes( pNtk->pManName, Abc_ObjName(pObj), ABC_OBJ_PI, ABC_OBJ_BO );
        if ( nCiId == -1 )
            continue;
        pObjCi = Abc_NtkObj( pNtk, nCiId );
        assert( !strcmp( Abc_ObjName(pObj), Abc_ObjName(pObjCi) ) );
        pFanin = Abc_ObjFanin0(pObj);
        if ( pFanin == pObjCi )
            continue;
        assert( Abc_NodeIsBuf(pFanin) );
        Abc_ObjPatchFanin( pObj, pFanin, pObjCi );
        if ( Abc_ObjFanoutNum(pFanin) == 0 )
            Abc_NtkDeleteObj( pFanin );
        Count++;
    }
    if ( Count )
        printf( "Redirected %d POs from buffers to PIs with the same name.\n", Count );
}